

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::ContactMaterial::ContactMaterial(ContactMaterial *this,RoboSimian *robot)

{
  shared_ptr<chrono::robosimian::ContactMaterial> shared_this;
  __shared_ptr<chrono::ChContactContainer::AddContactCallback,(__gnu_cxx::_Lock_policy)2>
  a_Stack_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<chrono::robosimian::ContactMaterial,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->super_AddContactCallback)._vptr_AddContactCallback =
       (_func_int **)&PTR__AddContactCallback_0019fab0;
  this->m_robot = robot;
  std::__shared_ptr<chrono::robosimian::ContactMaterial,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::robosimian::ContactMaterial,chrono::robosimian::ContactMaterial::__shared_ptr(chrono::robosimian::RoboSimian*)::_lambda(chrono::robosimian::ContactMaterial*)_1_,void>
            ((__shared_ptr<chrono::robosimian::ContactMaterial,(__gnu_cxx::_Lock_policy)2> *)
             &local_28,this);
  std::__shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             (__shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2> *)
             (this->m_robot->m_system + 0x158));
  std::__shared_ptr<chrono::ChContactContainer::AddContactCallback,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::robosimian::ContactMaterial,void>(a_Stack_48,&local_28);
  (**(code **)(*(long *)local_38._M_ptr + 0x210))(local_38._M_ptr,a_Stack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

ContactMaterial(RoboSimian* robot) : m_robot(robot) {
        std::shared_ptr<ContactMaterial> shared_this(this, [](ContactMaterial*) {});
        m_robot->GetSystem()->GetContactContainer()->RegisterAddContactCallback(shared_this);
    }